

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall Screen_Manager::Block(Screen_Manager *this,timeval *timeout)

{
  bool bVar1;
  int local_b4;
  undefined1 local_b0 [4];
  int new_nfds;
  fd_set read_Fd_Select;
  undefined8 uStack_28;
  int status;
  timeval multiDisplayTimeout;
  timeval *timeout_local;
  Screen_Manager *this_local;
  
  multiDisplayTimeout.tv_usec = (__suseconds_t)timeout;
  if ((More_Than_One_Display) && (timeout == (timeval *)0x0)) {
    uStack_28 = 0;
    multiDisplayTimeout.tv_sec = 100;
    multiDisplayTimeout.tv_usec = (__suseconds_t)&stack0xffffffffffffffd8;
  }
  memcpy(local_b0,&this->read_flag,0x80);
  bVar1 = Am_Connection::Active();
  if (bVar1) {
    local_b4 = Am_Connection::Merge_Mask((fd_set *)local_b0);
    if (local_b4 < this->nfds) {
      local_b4 = this->nfds;
    }
  }
  else {
    local_b4 = this->nfds;
  }
  read_Fd_Select.fds_bits[0xf]._4_4_ =
       select(local_b4,(fd_set *)local_b0,(fd_set *)0x0,(fd_set *)0x0,
              (timeval *)multiDisplayTimeout.tv_usec);
  if (read_Fd_Select.fds_bits[0xf]._4_4_ < 0) {
    perror("Am_Error in Block");
  }
  bVar1 = Am_Connection::Sockets_Have_Input((fd_set *)local_b0);
  if (bVar1) {
    Am_Connection::Handle_Sockets((fd_set *)local_b0);
  }
  return;
}

Assistant:

void
Screen_Manager::Block(timeval *timeout)
{
  //
  // Right now there is no way to wait on several displays at once. To do
  // that we would have to implement a separate thread for each display.
  //
  // So if the caller did not specify a timeout then we will end up
  // blocking on the first display even if there are events waiting on
  // other displays.
  //
  // To get around this, if there are multiple displays then we force a
  // small timeout. This gives us proper operation in applications which
  // only use a single display and a busy-wait-loop in applications which
  // use multiple displays.
  //
  timeval multiDisplayTimeout;

  if (More_Than_One_Display && (timeout == nullptr)) {
    multiDisplayTimeout.tv_sec = 0;
    multiDisplayTimeout.tv_usec = 100;
    timeout = &multiDisplayTimeout;
  }

  int status;
  // We only want to block until we time out.  If we have no event
  // by then, oh well, just exit anyway.

  // read_Fd_Select is destructively modified by select() so save a copy
  fd_set read_Fd_Select = read_flag;

  ////////////////////////////////////////////////////////////////
  // Networking hooks
  int new_nfds = 0;

  if (Am_Connection::Active()) {
    new_nfds = Am_Connection::Merge_Mask(&read_Fd_Select);
    if (nfds > new_nfds)
      new_nfds = nfds;
  } else // No open connections
  {
    new_nfds = nfds;
  }

  // Return from Networking Hooks
  //////////////////////////////////////////////////////////////
  status = select(new_nfds, &read_Fd_Select, nullptr, nullptr, timeout);
  if (status < 0)
    perror("Am_Error in Block");

  //////////////////////////////////////////////////////////////
  // One last Networking hook

  if (Am_Connection::Sockets_Have_Input(&read_Fd_Select))
    Am_Connection::Handle_Sockets(&read_Fd_Select);

  // End of Networking hooks.
  /////////////////////////////////////////////////////////////
}